

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O2

void __thiscall sf::priv::JoystickManager::update(JoystickManager *this)

{
  JoystickImpl *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int __oflag;
  Identification *this_01;
  JoystickState *pJVar5;
  Identification *pIVar6;
  Identification *pIVar7;
  ulong uVar8;
  byte bVar9;
  JoystickCaps JVar10;
  JoystickState local_78;
  
  bVar9 = 0;
  this_01 = &this->m_joysticks[0].identification;
  uVar8 = 0;
  lVar1 = 0x11;
  do {
    if (uVar8 == 8) {
      return;
    }
    this_00 = (JoystickImpl *)(&this_01[-7].name.m_string.field_2._M_allocated_capacity + 1);
    pIVar7 = this_01 + -2;
    if (*(char *)&this_01[-2].name.m_string._M_dataplus._M_p == '\x01') {
      JoystickImpl::update(&local_78,this_00);
      pJVar5 = &local_78;
      pIVar6 = pIVar7;
      for (lVar4 = lVar1; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined4 *)&(pIVar6->name).m_string._M_dataplus._M_p = *(undefined4 *)pJVar5;
        pJVar5 = (JoystickState *)((long)pJVar5 + ((ulong)bVar9 * -2 + 1) * 4);
        pIVar6 = (Identification *)((long)pIVar6 + (ulong)bVar9 * -8 + 4);
      }
      if (*(char *)&(pIVar7->name).m_string._M_dataplus._M_p == '\0') {
        JoystickImpl::close(this_00,(int)pJVar5);
        JoystickCaps::JoystickCaps((JoystickCaps *)&local_78);
        this_01[-1].productId = (uint)local_78.axes[1];
        *(undefined8 *)((long)&this_01[-1].name.m_string.field_2 + 0xc) = local_78._0_8_;
        JoystickState::JoystickState(&local_78);
        pJVar5 = &local_78;
        for (lVar4 = lVar1; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined4 *)&(pIVar7->name).m_string._M_dataplus._M_p = *(undefined4 *)pJVar5;
          pJVar5 = (JoystickState *)((long)pJVar5 + ((ulong)bVar9 * -2 + 1) * 4);
          pIVar7 = (Identification *)((long)pIVar7 + (ulong)bVar9 * -8 + 4);
        }
        Joystick::Identification::Identification((Identification *)&local_78);
        Joystick::Identification::operator=(this_01,(Identification *)&local_78);
LAB_001c8c27:
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_78);
      }
    }
    else {
      bVar2 = JoystickImpl::isConnected((uint)uVar8);
      if (bVar2) {
        iVar3 = JoystickImpl::open(this_00,(char *)(uVar8 & 0xffffffff),__oflag);
        if ((char)iVar3 != '\0') {
          JVar10 = JoystickImpl::getCapabilities(this_00);
          *(JoystickCaps *)((long)&this_01[-1].name.m_string.field_2 + 0xc) = JVar10;
          JoystickImpl::update(&local_78,this_00);
          pJVar5 = &local_78;
          for (lVar4 = lVar1; lVar4 != 0; lVar4 = lVar4 + -1) {
            *(undefined4 *)&(pIVar7->name).m_string._M_dataplus._M_p = *(undefined4 *)pJVar5;
            pJVar5 = (JoystickState *)((long)pJVar5 + ((ulong)bVar9 * -2 + 1) * 4);
            pIVar7 = (Identification *)((long)pIVar7 + (ulong)bVar9 * -8 + 4);
          }
          JoystickImpl::getIdentification((Identification *)&local_78,this_00);
          Joystick::Identification::operator=(this_01,(Identification *)&local_78);
          goto LAB_001c8c27;
        }
      }
    }
    uVar8 = uVar8 + 1;
    this_01 = (Identification *)&this_01[7].name.m_string.field_2;
  } while( true );
}

Assistant:

void JoystickManager::update()
{
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        Item& item = m_joysticks[i];

        if (item.state.connected)
        {
            // Get the current state of the joystick
            item.state = item.joystick.update();

            // Check if it's still connected
            if (!item.state.connected)
            {
                item.joystick.close();
                item.capabilities   = JoystickCaps();
                item.state          = JoystickState();
                item.identification = Joystick::Identification();
            }
        }
        else
        {
            // Check if the joystick was connected since last update
            if (JoystickImpl::isConnected(i))
            {
                if (item.joystick.open(i))
                {
                    item.capabilities   = item.joystick.getCapabilities();
                    item.state          = item.joystick.update();
                    item.identification = item.joystick.getIdentification();
                }
            }
        }
    }
}